

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsortfilterproxymodel.cpp
# Opt level: O2

bool __thiscall
QSortFilterProxyModel::filterAcceptsRow
          (QSortFilterProxyModel *this,int source_row,QModelIndex *source_parent)

{
  QObjectCompatProperty<QSortFilterProxyModelPrivate,_QRegularExpression,_&QSortFilterProxyModelPrivate::_qt_property_filter_regularexpression_offset,_&QSortFilterProxyModelPrivate::setFilterRegularExpressionForwarder,_nullptr,_nullptr>
  *this_00;
  QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
  *this_01;
  QObjectCompatProperty<QSortFilterProxyModelPrivate,_int,_&QSortFilterProxyModelPrivate::_qt_property_filter_column_offset,_&QSortFilterProxyModelPrivate::setFilterKeyColumnForwarder,_nullptr,_nullptr>
  *this_02;
  long lVar1;
  long *plVar2;
  QAbstractItemModel *pQVar3;
  bool bVar4;
  uint uVar5;
  parameter_type pVar6;
  parameter_type pVar7;
  uint uVar8;
  parameter_type pQVar9;
  uint uVar10;
  long in_FS_OFFSET;
  bool local_c1;
  QArrayDataPointer<char16_t> local_98;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  QVariant local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  this_00 = (QObjectCompatProperty<QSortFilterProxyModelPrivate,_QRegularExpression,_&QSortFilterProxyModelPrivate::_qt_property_filter_regularexpression_offset,_&QSortFilterProxyModelPrivate::setFilterRegularExpressionForwarder,_nullptr,_nullptr>
             *)(lVar1 + 0x118);
  pQVar9 = QObjectCompatProperty<QSortFilterProxyModelPrivate,_QRegularExpression,_&QSortFilterProxyModelPrivate::_qt_property_filter_regularexpression_offset,_&QSortFilterProxyModelPrivate::setFilterRegularExpressionForwarder,_nullptr,_nullptr>
           ::value(this_00);
  QRegularExpression::pattern((QString *)&local_58,pQVar9);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
  if (local_58.d.data._16_8_ == 0) {
    local_c1 = true;
  }
  else {
    this_01 = (QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
               *)(lVar1 + 0xd8);
    QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
    ::value(this_01);
    uVar5 = (**(code **)(**(long **)(lVar1 + 0xd8) + 0x80))(*(long **)(lVar1 + 0xd8),source_parent);
    this_02 = (QObjectCompatProperty<QSortFilterProxyModelPrivate,_int,_&QSortFilterProxyModelPrivate::_qt_property_filter_column_offset,_&QSortFilterProxyModelPrivate::setFilterKeyColumnForwarder,_nullptr,_nullptr>
               *)(lVar1 + 0x108);
    pVar6 = QObjectCompatProperty<QSortFilterProxyModelPrivate,_int,_&QSortFilterProxyModelPrivate::_qt_property_filter_column_offset,_&QSortFilterProxyModelPrivate::setFilterKeyColumnForwarder,_nullptr,_nullptr>
            ::value(this_02);
    if (pVar6 == -1) {
      uVar10 = 0;
      if ((int)uVar5 < 1) {
        uVar5 = 0;
      }
      do {
        local_c1 = uVar5 != uVar10;
        if (uVar5 == uVar10) break;
        local_68 = &DAT_aaaaaaaaaaaaaaaa;
        local_78 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
        QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
        ::value(this_01);
        pQVar3 = (this_01->super_QPropertyData<QAbstractItemModel_*>).val;
        (*(pQVar3->super_QObject)._vptr_QObject[0xc])
                  (&local_78,pQVar3,(ulong)(uint)source_row,(ulong)uVar10,source_parent);
        local_98.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_98.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_98.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
        ::value(this_01);
        pQVar3 = (this_01->super_QPropertyData<QAbstractItemModel_*>).val;
        uVar8 = QObjectCompatProperty<QSortFilterProxyModelPrivate,_int,_&QSortFilterProxyModelPrivate::_qt_property_filter_role_offset,_&QSortFilterProxyModelPrivate::setFilterRoleForwarder,_&QSortFilterProxyModelPrivate::filterRoleChangedForwarder,_nullptr>
                ::value((QObjectCompatProperty<QSortFilterProxyModelPrivate,_int,_&QSortFilterProxyModelPrivate::_qt_property_filter_role_offset,_&QSortFilterProxyModelPrivate::setFilterRoleForwarder,_&QSortFilterProxyModelPrivate::filterRoleChangedForwarder,_nullptr>
                         *)(lVar1 + 0x10c));
        (*(pQVar3->super_QObject)._vptr_QObject[0x12])(&local_58,pQVar3,&local_78,(ulong)uVar8);
        ::QVariant::toString((QString *)&local_98,&local_58);
        ::QVariant::~QVariant(&local_58);
        pQVar9 = QObjectCompatProperty<QSortFilterProxyModelPrivate,_QRegularExpression,_&QSortFilterProxyModelPrivate::_qt_property_filter_regularexpression_offset,_&QSortFilterProxyModelPrivate::setFilterRegularExpressionForwarder,_nullptr,_nullptr>
                 ::value(this_00);
        bVar4 = QString::contains((QString *)&local_98,pQVar9,(QRegularExpressionMatch *)0x0);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
        uVar10 = uVar10 + 1;
      } while (!bVar4);
    }
    else {
      local_c1 = true;
      pVar6 = QObjectCompatProperty<QSortFilterProxyModelPrivate,_int,_&QSortFilterProxyModelPrivate::_qt_property_filter_column_offset,_&QSortFilterProxyModelPrivate::setFilterKeyColumnForwarder,_nullptr,_nullptr>
              ::value(this_02);
      if (pVar6 < (int)uVar5) {
        local_68 = &DAT_aaaaaaaaaaaaaaaa;
        local_78 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
        QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
        ::value(this_01);
        plVar2 = *(long **)(lVar1 + 0xd8);
        pVar6 = QObjectCompatProperty<QSortFilterProxyModelPrivate,_int,_&QSortFilterProxyModelPrivate::_qt_property_filter_column_offset,_&QSortFilterProxyModelPrivate::setFilterKeyColumnForwarder,_nullptr,_nullptr>
                ::value(this_02);
        (**(code **)(*plVar2 + 0x60))(&local_78,plVar2,source_row,pVar6,source_parent);
        local_98.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_98.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_98.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
        ::value(this_01);
        plVar2 = *(long **)(lVar1 + 0xd8);
        pVar7 = QObjectCompatProperty<QSortFilterProxyModelPrivate,_int,_&QSortFilterProxyModelPrivate::_qt_property_filter_role_offset,_&QSortFilterProxyModelPrivate::setFilterRoleForwarder,_&QSortFilterProxyModelPrivate::filterRoleChangedForwarder,_nullptr>
                ::value((QObjectCompatProperty<QSortFilterProxyModelPrivate,_int,_&QSortFilterProxyModelPrivate::_qt_property_filter_role_offset,_&QSortFilterProxyModelPrivate::setFilterRoleForwarder,_&QSortFilterProxyModelPrivate::filterRoleChangedForwarder,_nullptr>
                         *)(lVar1 + 0x10c));
        (**(code **)(*plVar2 + 0x90))(&local_58,plVar2,&local_78,pVar7);
        ::QVariant::toString((QString *)&local_98,&local_58);
        ::QVariant::~QVariant(&local_58);
        pQVar9 = QObjectCompatProperty<QSortFilterProxyModelPrivate,_QRegularExpression,_&QSortFilterProxyModelPrivate::_qt_property_filter_regularexpression_offset,_&QSortFilterProxyModelPrivate::setFilterRegularExpressionForwarder,_nullptr,_nullptr>
                 ::value(this_00);
        local_c1 = QString::contains((QString *)&local_98,pQVar9,(QRegularExpressionMatch *)0x0);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return local_c1;
  }
  __stack_chk_fail();
}

Assistant:

bool QSortFilterProxyModel::filterAcceptsRow(int source_row, const QModelIndex &source_parent) const
{
    Q_D(const QSortFilterProxyModel);

    if (d->filter_regularexpression.value().pattern().isEmpty())
        return true;

    int column_count = d->model->columnCount(source_parent);
    if (d->filter_column == -1) {
        for (int column = 0; column < column_count; ++column) {
            QModelIndex source_index = d->model->index(source_row, column, source_parent);
            QString key = d->model->data(source_index, d->filter_role).toString();
            if (key.contains(d->filter_regularexpression.value()))
                return true;
        }
        return false;
    }

    if (d->filter_column >= column_count) // the column may not exist
        return true;
    QModelIndex source_index = d->model->index(source_row, d->filter_column, source_parent);
    QString key = d->model->data(source_index, d->filter_role).toString();
    return key.contains(d->filter_regularexpression.value());
}